

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1a_vote.cpp
# Opt level: O2

int main(void)

{
  _Rb_tree_header *p_Var1;
  istream *piVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> v;
  size_t k;
  size_t n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  m;
  key_type local_88;
  ulong local_68;
  long local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1051b8) = 0;
  piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
  p_Var1 = &local_58._M_impl.super__Rb_tree_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while( true ) {
    bVar6 = local_60 == 0;
    local_60 = local_60 + -1;
    if (bVar6) break;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity =
         local_88.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::operator>>((istream *)&std::cin,(string *)&local_88);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&local_58,&local_88);
    *pmVar3 = *pmVar3 + 1;
    std::__cxx11::string::~string((string *)&local_88);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  for (p_Var4 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict1 *)(p_Var4 + 2));
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_88._M_dataplus._M_p,local_88._M_string_length);
  if ((ulong)((long)(local_88._M_string_length - (long)local_88._M_dataplus._M_p) >> 2) < local_68)
  {
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,*(int *)local_88._M_dataplus._M_p);
    std::operator<<(poVar5,"\n");
  }
  else {
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        *(int *)(local_88._M_dataplus._M_p +
                                local_68 * -4 +
                                (local_88._M_string_length - (long)local_88._M_dataplus._M_p)));
    std::operator<<(poVar5,"\n");
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_58);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    size_t n, k;
    cin >> n >> k;
    map<string, int> m;

    while (n--) {
        string s;
        cin >> s;
        m[s]++;
    }
    vector<int> v;
    for (auto &x : m) {
        v.push_back(x.second);
    }
    sort(v.begin(), v.end());

    if (k > v.size()) {
        cout << *(v.begin()) << "\n";
    } else {
        cout << *(v.begin() + v.size() - k) << "\n";
    }
}